

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::DoubleToDecimalCast<float,duckdb::hugeint_t>
               (float input,hugeint_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  double dVar1;
  double dVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uchar in_R8B;
  hugeint_t hVar3;
  string error;
  allocator local_7d;
  float local_7c;
  double local_78;
  Exception local_70 [2];
  string local_50;
  
  local_78 = (double)input *
             *(double *)
              (NumericHelper::DOUBLE_POWERS_OF_TEN +
              (CONCAT71(in_register_00000009,scale) & 0xffffffff) * 8);
  local_7c = input;
  dVar2 = round(local_78);
  dVar1 = *(double *)
           (NumericHelper::DOUBLE_POWERS_OF_TEN +
           (CONCAT71(in_register_00000011,width) & 0xffffffff) * 8);
  if (-dVar1 < dVar2 && dVar2 < dVar1) {
    hVar3 = Cast::Operation<float,duckdb::hugeint_t>((float)local_78);
    *result = hVar3;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)local_70,"Could not cast value %f to DECIMAL(%d,%d)",&local_7d);
    Exception::ConstructMessage<float,unsigned_char,unsigned_char>
              (&local_50,local_70,(string *)(ulong)width,local_7c,scale,in_R8B);
    ::std::__cxx11::string::~string((string *)local_70);
    HandleCastError::AssignError(&local_50,parameters);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return -dVar1 < dVar2 && dVar2 < dVar1;
}

Assistant:

bool DoubleToDecimalCast(SRC input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	double value = input * NumericHelper::DOUBLE_POWERS_OF_TEN[scale];
	double roundedValue = round(value);
	if (roundedValue <= -NumericHelper::DOUBLE_POWERS_OF_TEN[width] ||
	    roundedValue >= NumericHelper::DOUBLE_POWERS_OF_TEN[width]) {
		string error = StringUtil::Format("Could not cast value %f to DECIMAL(%d,%d)", input, width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Cast::Operation<SRC, DST>(static_cast<SRC>(value));
	return true;
}